

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHTML.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_24;
  int local_20;
  int files;
  int count;
  int i;
  char **argv_local;
  int argc_local;
  
  local_24 = 0;
  for (files = 1; files < argc; files = files + 1) {
    iVar1 = strcmp(argv[files],"-debug");
    if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--debug"), iVar1 == 0)) {
      debug = debug + 1;
    }
    else {
      iVar1 = strcmp(argv[files],"-copy");
      if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--copy"), iVar1 == 0)) {
        copy = copy + 1;
      }
      else {
        iVar1 = strcmp(argv[files],"-push");
        if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--push"), iVar1 == 0)) {
          push = push + 1;
        }
        else {
          iVar1 = strcmp(argv[files],"-sax");
          if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--sax"), iVar1 == 0)) {
            sax = sax + 1;
          }
          else {
            iVar1 = strcmp(argv[files],"-noout");
            if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--noout"), iVar1 == 0)) {
              noout = noout + 1;
            }
            else {
              iVar1 = strcmp(argv[files],"-repeat");
              if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--repeat"), iVar1 == 0)) {
                repeat = repeat + 1;
              }
              else {
                iVar1 = strcmp(argv[files],"-encode");
                if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--encode"), iVar1 == 0)) {
                  files = files + 1;
                  encoding = argv[files];
                }
              }
            }
          }
        }
      }
    }
  }
  for (files = 1; files < argc; files = files + 1) {
    iVar1 = strcmp(argv[files],"-encode");
    if ((iVar1 == 0) || (iVar1 = strcmp(argv[files],"--encode"), iVar1 == 0)) {
      files = files + 1;
    }
    else if (*argv[files] != '-') {
      if (repeat == 0) {
        if (sax == 0) {
          parseAndPrintFile(argv[files]);
        }
        else {
          parseSAXFile(argv[files]);
        }
      }
      else {
        for (local_20 = 0; SBORROW4(local_20,repeat * 100) != local_20 + repeat * -100 < 0;
            local_20 = local_20 + 1) {
          if (sax == 0) {
            parseAndPrintFile(argv[files]);
          }
          else {
            parseSAXFile(argv[files]);
          }
        }
      }
      local_24 = local_24 + 1;
    }
  }
  if (local_24 == 0) {
    printf("Usage : %s [--debug] [--copy] [--copy] HTMLfiles ...\n",*argv);
    printf("\tParse the HTML files and output the result of the parsing\n");
    printf("\t--debug : dump a debug tree of the in-memory document\n");
    printf("\t--copy : used to test the internal copy implementation\n");
    printf("\t--sax : debug the sequence of SAX callbacks\n");
    printf("\t--repeat : parse the file 100 times, for timing\n");
    printf("\t--noout : do not print the result\n");
    printf("\t--push : use the push mode parser\n");
    printf("\t--encode encoding : output in the given encoding\n");
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i, count;
    int files = 0;

    for (i = 1; i < argc ; i++) {
#ifdef LIBXML_DEBUG_ENABLED
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else
#endif
	    if ((!strcmp(argv[i], "-copy")) || (!strcmp(argv[i], "--copy")))
	    copy++;
#ifdef LIBXML_PUSH_ENABLED
	else if ((!strcmp(argv[i], "-push")) || (!strcmp(argv[i], "--push")))
	    push++;
#endif /* LIBXML_PUSH_ENABLED */
	else if ((!strcmp(argv[i], "-sax")) || (!strcmp(argv[i], "--sax")))
	    sax++;
	else if ((!strcmp(argv[i], "-noout")) || (!strcmp(argv[i], "--noout")))
	    noout++;
	else if ((!strcmp(argv[i], "-repeat")) ||
	         (!strcmp(argv[i], "--repeat")))
	    repeat++;
	else if ((!strcmp(argv[i], "-encode")) ||
	         (!strcmp(argv[i], "--encode"))) {
	    i++;
	    encoding = argv[i];
        }
    }
    for (i = 1; i < argc ; i++) {
	if ((!strcmp(argv[i], "-encode")) ||
	         (!strcmp(argv[i], "--encode"))) {
	    i++;
	    continue;
        }
	if (argv[i][0] != '-') {
	    if (repeat) {
		for (count = 0;count < 100 * repeat;count++) {
		    if (sax)
			parseSAXFile(argv[i]);
		    else
			parseAndPrintFile(argv[i]);
		}
	    } else {
		if (sax)
		    parseSAXFile(argv[i]);
		else
		    parseAndPrintFile(argv[i]);
	    }
	    files ++;
	}
    }
    if (files == 0) {
	printf("Usage : %s [--debug] [--copy] [--copy] HTMLfiles ...\n",
	       argv[0]);
	printf("\tParse the HTML files and output the result of the parsing\n");
#ifdef LIBXML_DEBUG_ENABLED
	printf("\t--debug : dump a debug tree of the in-memory document\n");
#endif
	printf("\t--copy : used to test the internal copy implementation\n");
	printf("\t--sax : debug the sequence of SAX callbacks\n");
	printf("\t--repeat : parse the file 100 times, for timing\n");
	printf("\t--noout : do not print the result\n");
#ifdef LIBXML_PUSH_ENABLED
	printf("\t--push : use the push mode parser\n");
#endif /* LIBXML_PUSH_ENABLED */
	printf("\t--encode encoding : output in the given encoding\n");
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}